

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int int32_get(cram_block *b,int32_t *val)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = b->byte;
  iVar2 = -1;
  if (3 < (long)b->uncomp_size - sVar1) {
    *val = *(int32_t *)(b->data + sVar1);
    b->byte = sVar1 + 4;
    iVar2 = 4;
  }
  return iVar2;
}

Assistant:

int int32_get(cram_block *b, int32_t *val) {
    if (b->uncomp_size - BLOCK_SIZE(b) < 4)
	return -1;

    *val =
	 b->data[b->byte  ]        |
	(b->data[b->byte+1] <<  8) |
	(b->data[b->byte+2] << 16) |
	(b->data[b->byte+3] << 24);
    BLOCK_SIZE(b) += 4;
    return 4;
}